

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void __thiscall asmjit::ZoneHashBase::reset(ZoneHashBase *this,ZoneHeap *heap)

{
  size_t *psVar1;
  long *plVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  size_t in_RSI;
  size_t *in_RDI;
  ZoneHashNode **oldData;
  uint32_t slot;
  char *in_stack_00000390;
  int in_stack_0000039c;
  char *in_stack_000003a0;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  
  psVar1 = (size_t *)in_RDI[3];
  if (psVar1 != in_RDI + 4) {
    plVar2 = (long *)*in_RDI;
    uVar4 = (ulong)(uint)in_RDI[2];
    uVar5 = uVar4 * 8;
    if (*plVar2 == 0) {
      DebugUtils::assertionFailed(in_stack_000003a0,in_stack_0000039c,in_stack_00000390);
    }
    if (psVar1 == (size_t *)0x0) {
      DebugUtils::assertionFailed(in_stack_000003a0,in_stack_0000039c,in_stack_00000390);
    }
    if (uVar4 == 0) {
      DebugUtils::assertionFailed(in_stack_000003a0,in_stack_0000039c,in_stack_00000390);
    }
    if (uVar4 == 0) {
      DebugUtils::assertionFailed(in_stack_000003a0,in_stack_0000039c,in_stack_00000390);
    }
    if (uVar5 < 0x201) {
      if (uVar5 < 0x81) {
        in_stack_ffffffffffffffc4 = (uint)(uVar5 - 1 >> 5);
      }
      else {
        in_stack_ffffffffffffffc4 = (int)(uVar5 - 0x81 >> 6) + 4;
      }
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    if (bVar3) {
      *psVar1 = plVar2[(ulong)in_stack_ffffffffffffffc4 + 1];
      plVar2[(ulong)in_stack_ffffffffffffffc4 + 1] = (long)psVar1;
    }
    else {
      ZoneHeap::_releaseDynamic
                ((ZoneHeap *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI,
                 in_RSI);
    }
  }
  *in_RDI = in_RSI;
  in_RDI[1] = 0;
  *(undefined4 *)(in_RDI + 2) = 1;
  *(undefined4 *)((long)in_RDI + 0x14) = 1;
  in_RDI[3] = (size_t)(in_RDI + 4);
  in_RDI[4] = 0;
  return;
}

Assistant:

void ZoneHashBase::reset(ZoneHeap* heap) noexcept {
  ZoneHashNode** oldData = _data;
  if (oldData != _embedded)
    _heap->release(oldData, _bucketsCount * sizeof(ZoneHashNode*));

  _heap = heap;
  _size = 0;
  _bucketsCount = 1;
  _bucketsGrow = 1;
  _data = _embedded;
  _embedded[0] = nullptr;
}